

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tr1::tuple<testing::Matcher<void_const*>,void,void,void,void,void,void,void,void,void>,std::tr1::tuple<void_const*,void,void,void,void,void,void,void,void,void>>
               (tuple<testing::Matcher<const_void_*>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
                *matchers,
               tuple<const_void_*,_void,_void,_void,_void,_void,_void,_void,_void,_void> *values,
               ostream *os)

{
  void *pvVar1;
  MatcherInterface<const_void_*> *pMVar2;
  int iVar3;
  ostream *poVar4;
  Value value;
  type matcher;
  StringMatchResultListener listener;
  void *local_1f0;
  MatcherBase<const_void_*> local_1e8;
  string local_1d0;
  StringMatchResultListener local_1b0;
  
  Matcher<const_void_*>::Matcher((Matcher<const_void_*> *)&local_1e8,&matchers->f0_);
  pvVar1 = values->f0_;
  local_1f0 = pvVar1;
  StringMatchResultListener::StringMatchResultListener(&local_1b0);
  iVar3 = (*((local_1e8.impl_.value_)->super_MatcherDescriberInterface).
            _vptr_MatcherDescriberInterface[4])(local_1e8.impl_.value_,pvVar1,&local_1b0);
  if ((char)iVar3 == '\0') {
    poVar4 = std::operator<<(os,"  Expected arg #");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4,": ");
    pMVar2 = (matchers->f0_).super_MatcherBase<const_void_*>.impl_.value_;
    (*(pMVar2->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[2])(pMVar2,os);
    std::operator<<(os,"\n           Actual: ");
    PrintTo<void_const*>(&local_1f0,os);
    std::__cxx11::stringbuf::str();
    PrintIfNotEmpty(&local_1d0,os);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::operator<<(os,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(&local_1b0);
  MatcherBase<const_void_*>::~MatcherBase(&local_1e8);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }